

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_try_write2(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  int iVar1;
  
  iVar1 = -0xb;
  if ((stream->connect_req == (uv_connect_t *)0x0) && (stream->write_queue_size == 0)) {
    iVar1 = uv__check_before_write(stream,nbufs,(uv_stream_t *)0x0);
    if (-1 < iVar1) {
      iVar1 = uv__try_write(stream,bufs,nbufs,send_handle);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int uv_try_write2(uv_stream_t* stream,
                  const uv_buf_t bufs[],
                  unsigned int nbufs,
                  uv_stream_t* send_handle) {
  int err;

  /* Connecting or already writing some data */
  if (stream->connect_req != NULL || stream->write_queue_size != 0)
    return UV_EAGAIN;

  err = uv__check_before_write(stream, nbufs, NULL);
  if (err < 0)
    return err;

  return uv__try_write(stream, bufs, nbufs, send_handle);
}